

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O0

int16_t FAudio_INTERNAL_ParseNibble
                  (uint8_t nibble,uint8_t predictor,int16_t *delta,int16_t *sample1,int16_t *sample2
                  )

{
  int local_34;
  int16_t local_30;
  int16_t sample;
  int32_t sampleInt;
  int8_t signedNibble;
  int16_t *sample2_local;
  int16_t *sample1_local;
  int16_t *delta_local;
  uint8_t predictor_local;
  uint8_t nibble_local;
  
  signedNibble = nibble;
  if ((nibble & 8) != 0) {
    signedNibble = nibble + 0xf0;
  }
  local_34 = (int)signedNibble * (int)*delta +
             ((int)*sample1 * FAudio_INTERNAL_ParseNibble::AdaptCoeff_1[predictor] +
             (int)*sample2 * FAudio_INTERNAL_ParseNibble::AdaptCoeff_2[predictor]) / 0x100;
  if (local_34 < 0x8000) {
    if (local_34 < -0x8000) {
      local_34 = -0x8000;
    }
    local_30 = (int16_t)local_34;
  }
  else {
    local_30 = 0x7fff;
  }
  *sample2 = *sample1;
  *sample1 = local_30;
  *delta = (int16_t)((long)(FAudio_INTERNAL_ParseNibble::AdaptionTable[nibble] * (int)*delta) /
                    0x100);
  if (*delta < 0x10) {
    *delta = 0x10;
  }
  return local_30;
}

Assistant:

static inline int16_t FAudio_INTERNAL_ParseNibble(
	uint8_t nibble,
	uint8_t predictor,
	int16_t *delta,
	int16_t *sample1,
	int16_t *sample2
) {
	static const int32_t AdaptionTable[16] =
	{
		230, 230, 230, 230, 307, 409, 512, 614,
		768, 614, 512, 409, 307, 230, 230, 230
	};
	static const int32_t AdaptCoeff_1[7] =
	{
		256, 512, 0, 192, 240, 460, 392
	};
	static const int32_t AdaptCoeff_2[7] =
	{
		0, -256, 0, 64, 0, -208, -232
	};

	int8_t signedNibble;
	int32_t sampleInt;
	int16_t sample;

	signedNibble = (int8_t) nibble;
	if (signedNibble & 0x08)
	{
		signedNibble -= 0x10;
	}

	sampleInt = (
		(*sample1 * AdaptCoeff_1[predictor]) +
		(*sample2 * AdaptCoeff_2[predictor])
	) / 256;
	sampleInt += signedNibble * (*delta);
	sample = FAudio_clamp(sampleInt, -32768, 32767);

	*sample2 = *sample1;
	*sample1 = sample;
	*delta = (int16_t) (AdaptionTable[nibble] * (int32_t) (*delta) / 256);
	if (*delta < 16)
	{
		*delta = 16;
	}
	return sample;
}